

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

int __thiscall DetectorSS::PointQueryMerge(DetectorSS *this,uint32_t key)

{
  int iVar1;
  uchar *__s;
  uint64_t uVar2;
  undefined4 in_ESI;
  DetectorSS *in_RDI;
  ulong __n;
  DetectorSS *unaff_retaddr;
  uint32_t in_stack_00000008;
  int in_stack_0000000c;
  void *in_stack_00000010;
  uint bucket_1;
  int i_1;
  uint bucket;
  int i;
  uint32_t hashval [4];
  uint32_t hkey [3];
  uchar *mcount;
  int ret;
  int local_44;
  int local_3c;
  uint local_38 [8];
  uchar *local_18;
  undefined4 uVar3;
  DetectorSS *pDVar4;
  
  uVar3 = 0;
  __n = (ulong)((in_RDI->ss_).offsets[(in_RDI->ss_).c] + 7 >> 3);
  pDVar4 = in_RDI;
  __s = (uchar *)operator_new__(__n);
  memset(__s,0,__n);
  local_18 = __s;
  memset(local_38,0,0x10);
  MurmurHash3_x64_128(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
  for (local_3c = 0; local_3c < (in_RDI->ss_).tdepth; local_3c = local_3c + 1) {
    iVar1 = (int)((ulong)local_38[local_3c] * (long)(in_RDI->ss_).width >> 0x20);
    if (local_3c == 0) {
      Copybmp(in_RDI,local_18,*(in_RDI->ss_).counts,iVar1 * (in_RDI->ss_).offsets[(in_RDI->ss_).c],
              (in_RDI->ss_).offsets[(in_RDI->ss_).c]);
    }
    else {
      Intersec(in_RDI,local_18,(in_RDI->ss_).counts[local_3c],
               iVar1 * (in_RDI->ss_).offsets[(in_RDI->ss_).c],(in_RDI->ss_).offsets[(in_RDI->ss_).c]
              );
    }
  }
  for (local_44 = 4; local_44 < (in_RDI->ss_).depth; local_44 = local_44 + 1) {
    uVar2 = MurmurHash64A(&stack0xfffffffffffffff4,(in_RDI->ss_).lgn / 8,
                          (in_RDI->ss_).hash[local_44]);
    Intersec(in_RDI,local_18,(in_RDI->ss_).counts[local_44],
             (int)((uVar2 & 0xffffffff) * (long)(in_RDI->ss_).width >> 0x20) *
             (in_RDI->ss_).offsets[(in_RDI->ss_).c],(in_RDI->ss_).offsets[(in_RDI->ss_).c]);
  }
  iVar1 = Estimate(unaff_retaddr,(int)((ulong)pDVar4 >> 0x20),(uchar *)CONCAT44(in_ESI,uVar3));
  if (local_18 != (uchar *)0x0) {
    operator_delete__(local_18);
  }
  return iVar1;
}

Assistant:

int DetectorSS::PointQueryMerge(uint32_t key) {
	int ret = 0;
	unsigned char* mcount = new unsigned char[(ss_.offsets[ss_.c] + 7) >> 3]();
	uint32_t hkey[3] = { key, key, key };
	uint32_t hashval[4] = { 0 };
	MurmurHash3_x64_128((unsigned char*)hkey, 12, ss_.hash[0], (unsigned char*)hashval);
	for (int i = 0; i < ss_.tdepth; i++) {
		unsigned bucket = (uint32_t)hashval[i] * (unsigned long)ss_.width >> 32;
		if (i == 0) {
			Copybmp(mcount, ss_.counts[i], bucket * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
		}
		else
			Intersec(mcount, ss_.counts[i], bucket * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
	}
	for (int i = 4; i < ss_.depth; i++) {
		unsigned bucket = MurmurHash64A((unsigned char*)(&key), ss_.lgn / 8, ss_.hash[i]);
		bucket = (bucket * (unsigned long)ss_.width) >> 32;
		Intersec(mcount, ss_.counts[i], bucket * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
	}
	ret = Estimate(0, mcount);
	delete[] mcount;
	return ret;
}